

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::reserve_source(CTcTokenizer *this,size_t len)

{
  CTcTokSrcBlock *this_00;
  char *pcVar1;
  long in_RSI;
  long in_RDI;
  CTcTokSrcBlock *blk;
  
  if (*(ulong *)(in_RDI + 0xcc0) < in_RSI + 1U) {
    if (50000 < in_RSI + 1U) {
      throw_fatal_error(0x2744,50000);
    }
    this_00 = (CTcTokSrcBlock *)operator_new(0xc358);
    CTcTokSrcBlock::CTcTokSrcBlock(this_00);
    CTcTokSrcBlock::set_next(*(CTcTokSrcBlock **)(in_RDI + 0xcb0),this_00);
    *(CTcTokSrcBlock **)(in_RDI + 0xcb0) = this_00;
    *(undefined8 *)(in_RDI + 0xcc0) = 50000;
    pcVar1 = CTcTokSrcBlock::get_buf(this_00);
    *(char **)(in_RDI + 0xcb8) = pcVar1;
  }
  return;
}

Assistant:

void CTcTokenizer::reserve_source(size_t len)
{
    /* 
     *   if we don't have enough space for this line in the current source
     *   block, start a new block 
     */
    if (len + 1 > src_rem_)
    {
        CTcTokSrcBlock *blk;

        /* 
         *   if the line is too long for a source block, throw a fatal
         *   error 
         */
        if (len + 1 > TCTOK_SRC_BLOCK_SIZE)
            throw_fatal_error(TCERR_SRCLINE_TOO_LONG,
                              (long)TCTOK_SRC_BLOCK_SIZE);

        /* allocate a new block */
        blk = new CTcTokSrcBlock();

        /* link it into our list */
        src_cur_->set_next(blk);

        /* it's now the current block */
        src_cur_ = blk;

        /* start writing at the start of this block */
        src_rem_ = TCTOK_SRC_BLOCK_SIZE;
        src_ptr_ = blk->get_buf();
    }
}